

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O2

size_t axl::sl::findBit(size_t *map,size_t pageCount,size_t from)

{
  byte bVar1;
  size_t *psVar2;
  size_t sVar3;
  ulong uVar4;
  
  uVar4 = from >> 6;
  sVar3 = 0xffffffffffffffff;
  if (uVar4 < pageCount) {
    sVar3 = (map[uVar4] >> ((byte)from & 0x3f)) << ((byte)from & 0x3f);
    if (sVar3 == 0) {
      psVar2 = map + uVar4;
      uVar4 = uVar4 << 6;
      do {
        psVar2 = psVar2 + 1;
        if (map + pageCount <= psVar2) {
          return 0xffffffffffffffff;
        }
        sVar3 = *psVar2;
        uVar4 = uVar4 + 0x40;
      } while (sVar3 == 0);
    }
    else {
      uVar4 = from & 0xffffffffffffffc0;
    }
    bVar1 = getLoBitIdx64(sVar3);
    sVar3 = bVar1 + uVar4;
  }
  return sVar3;
}

Assistant:

size_t
findBit(
	const size_t* map,
	size_t pageCount,
	size_t from
) {
	size_t i = from / AXL_PTR_BITS;
	if (i >= pageCount)
		return -1;

	const size_t* p = map + i;
	from &= AXL_PTR_BITS - 1;
	size_t x = *p & getHiBitmask(from);
	if (x)
		return i * AXL_PTR_BITS + getLoBitIdx(x);

	const size_t* end = map + pageCount;
	for (p++; p < end; p++)
		if (*p != 0)
			return (p - map) * AXL_PTR_BITS + getLoBitIdx(*p);

	return -1;
}